

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *camera,ssize_t id
          )

{
  pointer pRVar1;
  int __oflag;
  ulong uVar2;
  allocator local_189;
  Ref<embree::SceneGraph::Node> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_100,"AnimatedPerspectiveCamera ",&local_189);
  std::operator+(&local_e0,&local_100,"name=\"");
  std::operator+(&local_c0,&local_e0,&(camera->ptr->super_PerspectiveCameraNode).super_Node.name);
  std::operator+(&local_a0,&local_c0,"\" time_range=\"");
  std::__cxx11::to_string(&local_120,(camera->ptr->time_range).lower);
  std::operator+(&local_80,&local_a0,&local_120);
  std::operator+(&local_60,&local_80," ");
  std::__cxx11::to_string(&local_140,(camera->ptr->time_range).upper);
  std::operator+(&local_180,&local_60,&local_140);
  std::operator+(&local_40,&local_180,"\"");
  open(this,(char *)&local_40,__oflag);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  uVar2 = 0;
  while( true ) {
    pRVar1 = (camera->ptr->cameras).
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(camera->ptr->cameras).
                      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) <= uVar2)
    break;
    local_188.ptr = &(pRVar1[uVar2].ptr)->super_Node;
    if ((PerspectiveCameraNode *)local_188.ptr != (PerspectiveCameraNode *)0x0) {
      (*(((Node *)&(local_188.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
    }
    store(this,&local_188);
    if ((PerspectiveCameraNode *)local_188.ptr != (PerspectiveCameraNode *)0x0) {
      (*(((Node *)&(local_188.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
    }
    uVar2 = uVar2 + 1;
  }
  std::__cxx11::string::string(local_160,"AnimatedPerspectiveCamera",(allocator *)&local_180);
  close(this,(int)local_160);
  std::__cxx11::string::~string(local_160);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::AnimatedPerspectiveCameraNode> camera, ssize_t id)
  {
    open(std::string("AnimatedPerspectiveCamera ")+
         "name=\"" + camera->name + "\" "
         "time_range=\""+std::to_string(camera->time_range.lower)+" "+std::to_string(camera->time_range.upper)+"\"");
    
    for (size_t i=0; i<camera->size(); i++)
      store(camera->cameras[i].dynamicCast<SceneGraph::Node>());
    
    close("AnimatedPerspectiveCamera");
  }